

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_DisplayMaterialRef> *a)

{
  bool bVar1;
  bool bVar2;
  uint in_EAX;
  ON_DisplayMaterialRef *uuid;
  int iVar3;
  int count;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  if (a->m_a != (ON_DisplayMaterialRef *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity << 5);
  }
  a->m_count = 0;
  uStack_28 = (ulong)(uint)uStack_28;
  bVar2 = ReadInt32(this,1,(ON__INT32 *)((long)&uStack_28 + 4));
  if (0 < (int)uStack_28._4_4_ && bVar2) {
    ON_SimpleArray<ON_DisplayMaterialRef>::SetCapacity(a,(ulong)uStack_28._4_4_);
    if ((int)uStack_28._4_4_ < 1) {
      bVar2 = true;
    }
    else {
      iVar3 = 1;
      do {
        uuid = ON_SimpleArray<ON_DisplayMaterialRef>::AppendNew(a);
        bVar2 = ReadUuid(this,&uuid->m_viewport_id);
        if (!bVar2) {
          return false;
        }
        bVar2 = ReadUuid(this,&uuid->m_display_material_id);
        if (!bVar2) {
          return bVar2;
        }
        bVar1 = iVar3 < (int)uStack_28._4_4_;
        iVar3 = iVar3 + 1;
      } while (bVar1);
    }
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_DisplayMaterialRef>& a )
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    int i;
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadDisplayMaterialRef(a.AppendNew());
    }
  }
  return rc;
}